

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_localDict dict;
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ZSTD_CDict *in_stack_ffffffffffffffa0;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 local_20;
  ZSTD_CCtx *local_18;
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else {
    lVar1 = 0x488;
    if ((ZSTD_CCtx *)(cctx->workspace).workspace == cctx) {
      lVar1 = 0;
    }
    local_18 = cctx;
    sVar2 = ZSTD_cwksp_sizeof(&cctx->workspace);
    memcpy(local_40,&local_18->localDict,0x28);
    dict.dict = (void *)uStack_30;
    dict.dictBuffer = (void *)uStack_38;
    dict.dictSize = uStack_28;
    dict._24_8_ = local_20;
    dict.cdict = in_stack_ffffffffffffffa0;
    sVar3 = ZSTD_sizeof_localDict(dict);
    sVar4 = ZSTD_sizeof_mtctx(local_18);
    cctx_local = (ZSTD_CCtx *)(lVar1 + sVar2 + sVar3 + sVar4);
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}